

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttmtx.c
# Opt level: O0

void tt_face_get_metrics(TT_Face face,FT_Bool vertical,FT_UInt gindex,FT_Short *abearing,
                        FT_UShort *aadvance)

{
  FT_UInt16 FVar1;
  int local_80;
  uint local_7c;
  FT_Int b;
  FT_Int a;
  FT_Face f;
  void *v;
  FT_Service_MetricsVariations var;
  ulong uStack_58;
  FT_UShort k;
  FT_ULong table_end;
  FT_ULong table_size;
  FT_ULong table_pos;
  TT_HoriHeader *header;
  FT_Stream stream;
  FT_UShort *pFStack_28;
  FT_Error error;
  FT_UShort *aadvance_local;
  FT_Short *abearing_local;
  FT_UInt gindex_local;
  FT_Bool vertical_local;
  TT_Face face_local;
  
  header = (TT_HoriHeader *)(face->root).stream;
  v = face->var;
  if (vertical == '\0') {
    table_pos = (FT_ULong)&face->horizontal;
    table_size = face->horz_metrics_offset;
    table_end = face->horz_metrics_size;
  }
  else {
    f = (FT_Face)&face->vertical;
    table_size = face->vert_metrics_offset;
    table_end = face->vert_metrics_size;
    table_pos = (FT_ULong)f;
  }
  uStack_58 = table_size + table_end;
  var._6_2_ = *(ushort *)(table_pos + 0x26);
  pFStack_28 = aadvance;
  aadvance_local = (FT_UShort *)abearing;
  abearing_local._0_4_ = gindex;
  abearing_local._7_1_ = vertical;
  _gindex_local = face;
  if (var._6_2_ != 0) {
    if (gindex < var._6_2_) {
      table_size = (gindex << 2) + table_size;
      if ((table_size + 4 <= uStack_58) &&
         (stream._4_4_ = FT_Stream_Seek((FT_Stream)header,table_size), stream._4_4_ == 0)) {
        FVar1 = FT_Stream_ReadUShort((FT_Stream)header,(FT_Error *)((long)&stream + 4));
        *pFStack_28 = FVar1;
        if (stream._4_4_ == 0) {
          FVar1 = FT_Stream_ReadUShort((FT_Stream)header,(FT_Error *)((long)&stream + 4));
          *aadvance_local = FVar1;
          if (stream._4_4_ == 0) goto LAB_0033181f;
        }
      }
    }
    else {
      table_size = (long)(int)((var._6_2_ - 1) * 4) + table_size;
      if ((table_size + 2 <= uStack_58) &&
         (stream._4_4_ = FT_Stream_Seek((FT_Stream)header,table_size), stream._4_4_ == 0)) {
        FVar1 = FT_Stream_ReadUShort((FT_Stream)header,(FT_Error *)((long)&stream + 4));
        *pFStack_28 = FVar1;
        if (stream._4_4_ == 0) {
          table_size = (((FT_UInt)abearing_local - var._6_2_) * 2 + 4) + table_size;
          if (uStack_58 < table_size + 2) {
            *aadvance_local = 0;
          }
          else {
            stream._4_4_ = FT_Stream_Seek((FT_Stream)header,table_size);
            if (stream._4_4_ == 0) {
              FVar1 = FT_Stream_ReadUShort((FT_Stream)header,(FT_Error *)((long)&stream + 4));
              *aadvance_local = FVar1;
            }
            else {
              *aadvance_local = 0;
            }
          }
          goto LAB_0033181f;
        }
      }
    }
  }
  *aadvance_local = 0;
  *pFStack_28 = 0;
LAB_0033181f:
  if ((v != (void *)0x0) && (_gindex_local->blend != (GX_Blend)0x0)) {
    _b = _gindex_local;
    local_7c = (uint)*pFStack_28;
    local_80 = (int)(short)*aadvance_local;
    if (abearing_local._7_1_ == '\0') {
      if (*v != 0) {
        (**v)(_gindex_local,(FT_UInt)abearing_local,&local_7c);
      }
      if (*(long *)((long)v + 8) != 0) {
        (**(code **)((long)v + 8))(_b,(FT_UInt)abearing_local,&local_80);
      }
    }
    else {
      if (*(long *)((long)v + 0x18) != 0) {
        (**(code **)((long)v + 0x18))(_gindex_local,(FT_UInt)abearing_local,&local_7c);
      }
      if (*(long *)((long)v + 0x20) != 0) {
        (**(code **)((long)v + 0x20))(_b,(FT_UInt)abearing_local,&local_80);
      }
    }
    *pFStack_28 = (ushort)local_7c;
    *aadvance_local = (FT_UShort)local_80;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_get_metrics( TT_Face     face,
                       FT_Bool     vertical,
                       FT_UInt     gindex,
                       FT_Short   *abearing,
                       FT_UShort  *aadvance )
  {
    FT_Error        error;
    FT_Stream       stream = face->root.stream;
    TT_HoriHeader*  header;
    FT_ULong        table_pos, table_size, table_end;
    FT_UShort       k;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    FT_Service_MetricsVariations  var =
      (FT_Service_MetricsVariations)face->var;
#endif


    if ( vertical )
    {
      void*  v = &face->vertical;


      header     = (TT_HoriHeader*)v;
      table_pos  = face->vert_metrics_offset;
      table_size = face->vert_metrics_size;
    }
    else
    {
      header     = &face->horizontal;
      table_pos  = face->horz_metrics_offset;
      table_size = face->horz_metrics_size;
    }

    table_end = table_pos + table_size;

    k = header->number_Of_HMetrics;

    if ( k > 0 )
    {
      if ( gindex < (FT_UInt)k )
      {
        table_pos += 4 * gindex;
        if ( table_pos + 4 > table_end )
          goto NoData;

        if ( FT_STREAM_SEEK( table_pos ) ||
             FT_READ_USHORT( *aadvance ) ||
             FT_READ_SHORT( *abearing )  )
          goto NoData;
      }
      else
      {
        table_pos += 4 * ( k - 1 );
        if ( table_pos + 2 > table_end )
          goto NoData;

        if ( FT_STREAM_SEEK( table_pos ) ||
             FT_READ_USHORT( *aadvance ) )
          goto NoData;

        table_pos += 4 + 2 * ( gindex - k );
        if ( table_pos + 2 > table_end )
          *abearing = 0;
        else
        {
          if ( FT_STREAM_SEEK( table_pos ) )
            *abearing = 0;
          else
            (void)FT_READ_SHORT( *abearing );
        }
      }
    }
    else
    {
    NoData:
      *abearing = 0;
      *aadvance = 0;
    }

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( var && face->blend )
    {
      FT_Face  f = FT_FACE( face );
      FT_Int   a = (FT_Int)*aadvance;
      FT_Int   b = (FT_Int)*abearing;


      if ( vertical )
      {
        if ( var->vadvance_adjust )
          var->vadvance_adjust( f, gindex, &a );
        if ( var->tsb_adjust )
          var->tsb_adjust( f, gindex, &b );
      }
      else
      {
        if ( var->hadvance_adjust )
          var->hadvance_adjust( f, gindex, &a );
        if ( var->lsb_adjust )
          var->lsb_adjust( f, gindex, &b );
      }

      *aadvance = (FT_UShort)a;
      *abearing = (FT_Short)b;
    }
#endif
  }